

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decContext.cpp
# Opt level: O1

decContext * uprv_decContextSetStatusFromStringQuiet_63(decContext *context,char *string)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = strcmp(string,"Conversion syntax");
  if (iVar2 == 0) {
    *(byte *)&context->status = (byte)context->status | 1;
  }
  else {
    iVar2 = strcmp(string,"Division by zero");
    if (iVar2 == 0) {
      *(byte *)&context->status = (byte)context->status | 2;
    }
    else {
      iVar2 = strcmp(string,"Division impossible");
      if (iVar2 == 0) {
        *(byte *)&context->status = (byte)context->status | 4;
      }
      else {
        iVar2 = strcmp(string,"Division undefined");
        if (iVar2 == 0) {
          *(byte *)&context->status = (byte)context->status | 8;
        }
        else {
          iVar2 = strcmp(string,"Inexact");
          if (iVar2 == 0) {
            *(byte *)&context->status = (byte)context->status | 0x20;
          }
          else {
            iVar2 = strcmp(string,"Insufficient storage");
            if (iVar2 == 0) {
              *(byte *)&context->status = (byte)context->status | 0x10;
            }
            else {
              iVar2 = strcmp(string,"Invalid context");
              if (iVar2 == 0) {
                *(byte *)&context->status = (byte)context->status | 0x40;
              }
              else {
                iVar2 = strcmp(string,"Invalid operation");
                if (iVar2 == 0) {
                  *(byte *)&context->status = (byte)context->status | 0x80;
                }
                else {
                  iVar2 = strcmp(string,"Overflow");
                  if (iVar2 == 0) {
                    pbVar1 = (byte *)((long)&context->status + 1);
                    *pbVar1 = *pbVar1 | 2;
                  }
                  else {
                    iVar2 = strcmp(string,"Clamped");
                    if (iVar2 == 0) {
                      pbVar1 = (byte *)((long)&context->status + 1);
                      *pbVar1 = *pbVar1 | 4;
                    }
                    else {
                      iVar2 = strcmp(string,"Rounded");
                      if (iVar2 == 0) {
                        pbVar1 = (byte *)((long)&context->status + 1);
                        *pbVar1 = *pbVar1 | 8;
                      }
                      else {
                        iVar2 = strcmp(string,"Subnormal");
                        if (iVar2 == 0) {
                          pbVar1 = (byte *)((long)&context->status + 1);
                          *pbVar1 = *pbVar1 | 0x10;
                        }
                        else {
                          iVar2 = strcmp(string,"Underflow");
                          if (iVar2 == 0) {
                            pbVar1 = (byte *)((long)&context->status + 1);
                            *pbVar1 = *pbVar1 | 0x20;
                          }
                          else {
                            iVar2 = strcmp(string,"No status");
                            if (iVar2 != 0) {
                              context = (decContext *)0x0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return context;
}

Assistant:

U_CAPI decContext *  U_EXPORT2 uprv_decContextSetStatusFromStringQuiet(decContext *context,
                                                const char *string) {
  if (strcmp(string, DEC_Condition_CS)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Conversion_syntax);
  if (strcmp(string, DEC_Condition_DZ)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Division_by_zero);
  if (strcmp(string, DEC_Condition_DI)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Division_impossible);
  if (strcmp(string, DEC_Condition_DU)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Division_undefined);
  if (strcmp(string, DEC_Condition_IE)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Inexact);
  if (strcmp(string, DEC_Condition_IS)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Insufficient_storage);
  if (strcmp(string, DEC_Condition_IC)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Invalid_context);
  if (strcmp(string, DEC_Condition_IO)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Invalid_operation);
  #if DECSUBSET
  if (strcmp(string, DEC_Condition_LD)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Lost_digits);
  #endif
  if (strcmp(string, DEC_Condition_OV)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Overflow);
  if (strcmp(string, DEC_Condition_PA)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Clamped);
  if (strcmp(string, DEC_Condition_RO)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Rounded);
  if (strcmp(string, DEC_Condition_SU)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Subnormal);
  if (strcmp(string, DEC_Condition_UN)==0)
    return uprv_decContextSetStatusQuiet(context, DEC_Underflow);
  if (strcmp(string, DEC_Condition_ZE)==0)
    return context;
  return NULL;  /* Multiple status, or unknown  */
  }